

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Forward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  FILE *__stream;
  int iVar1;
  int64_t iVar2;
  TPZFMatrix<std::complex<float>_> *F;
  long *plVar3;
  ostream *poVar4;
  void *pvVar5;
  size_t sVar6;
  long in_RDI;
  int64_t position;
  int64_t i;
  TPZEqnArray<std::complex<float>_> REqnArray;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcc70;
  undefined4 in_stack_ffffffffffffcc88;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcc90;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcca0;
  DecomposeType dec_00;
  TPZEqnArray<std::complex<float>_> *this_00;
  long local_32c8 [3];
  TPZEqnArray<std::complex<float>_> *local_32b0;
  
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(in_stack_ffffffffffffcca0);
  local_32b0 = (TPZEqnArray<std::complex<float>_> *)0x0;
  while( true ) {
    this_00 = local_32b0;
    iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10));
    if (iVar2 <= (long)this_00) break;
    F = (TPZFMatrix<std::complex<float>_> *)
        TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),(int64_t)local_32b0);
    if ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable != (_func_int **)0x0) {
      __stream = *(FILE **)(in_RDI + 0xa0);
      plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),(int64_t)local_32b0);
      iVar1 = fseek(__stream,*plVar3,0);
      dec_00 = (DecomposeType)((ulong)plVar3 >> 0x20);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"fseek fail on Element ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_32b0);
        poVar4 = std::operator<<(poVar4," Position ");
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),(int64_t)local_32b0);
        pvVar5 = (void *)std::ostream::operator<<(poVar4,*plVar3);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::flush();
      }
      sVar6 = fread(local_32c8,8,1,*(FILE **)(in_RDI + 0xa0));
      if (sVar6 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"fread fail on Element ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_32b0);
        poVar4 = std::operator<<(poVar4," Position ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_32c8[0]);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"EOF ");
        iVar1 = feof(*(FILE **)(in_RDI + 0xa0));
        pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Error Number ");
        iVar1 = ferror(*(FILE **)(in_RDI + 0xa0));
        in_stack_ffffffffffffcc90 =
             (TPZEqnArray<std::complex<float>_> *)std::ostream::operator<<(poVar4,iVar1);
        std::ostream::operator<<(in_stack_ffffffffffffcc90,std::endl<char,std::char_traits<char>>);
        std::ostream::flush();
      }
      iVar1 = fseek(*(FILE **)(in_RDI + 0xa0),local_32c8[0],0);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"fseek fail on Element ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)local_32b0);
        in_stack_ffffffffffffcc70 =
             (TPZEqnArray<std::complex<float>_> *)std::operator<<(poVar4," Position ");
        pvVar5 = (void *)std::ostream::operator<<(in_stack_ffffffffffffcc70,local_32c8[0]);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::flush();
      }
      TPZEqnArray<std::complex<float>_>::Read
                (in_stack_ffffffffffffcc90,(FILE *)CONCAT44(iVar1,in_stack_ffffffffffffcc88));
      TPZEqnArray<std::complex<float>_>::EqnForward(this_00,F,dec_00);
    }
    local_32b0 = (TPZEqnArray<std::complex<float>_> *)((long)&local_32b0->fSymmetric + 1);
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(in_stack_ffffffffffffcc70);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Forward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	for(int64_t i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			if(fseek(fIOStream,fBlockPos[i],SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << fBlockPos[i] << endl;
				cout.flush();
			}
			int64_t position;
			if(!fread(&position,sizeof(int64_t),1,fIOStream)){
				cout << "fread fail on Element " << i << " Position " << position << endl;
				cout << "EOF " << feof(fIOStream) << endl;
				cout << "Error Number " << ferror(fIOStream) << endl;
				cout.flush();
			}
			if(fseek(fIOStream,position,SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << position << endl;
				cout.flush();
			}
			
			REqnArray.Read(fIOStream);
			REqnArray.EqnForward(f,dec);
		}
	}
}